

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::Utils::Variable::Descriptor::Descriptor
          (Descriptor *this,GLchar *name,GLchar *qualifiers,GLint expected_componenet,
          GLint expected_location,Interface *interface,GLuint n_array_elements,
          GLint expected_stride_of_element,GLuint offset)

{
  allocator<char> local_22;
  allocator<char> local_21;
  
  this->m_expected_component = expected_componenet;
  this->m_expected_location = expected_location;
  this->m_expected_stride_of_element = expected_stride_of_element;
  this->m_n_array_elements = n_array_elements;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_21);
  this->m_normalized = '\0';
  this->m_offset = offset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_qualifiers,qualifiers,&local_22);
  this->m_type = INTERFACE;
  (this->field_9).m_interface = interface;
  return;
}

Assistant:

Variable::Descriptor::Descriptor(const GLchar* name, const GLchar* qualifiers, GLint expected_componenet,
								 GLint expected_location, Interface* interface, GLuint n_array_elements,
								 GLint expected_stride_of_element, GLuint offset)
	: m_expected_component(expected_componenet)
	, m_expected_location(expected_location)
	, m_expected_stride_of_element(expected_stride_of_element)
	, m_n_array_elements(n_array_elements)
	, m_name(name)
	, m_normalized(GL_FALSE)
	, m_offset(offset)
	, m_qualifiers(qualifiers)
	, m_type(INTERFACE)
	, m_interface(interface)
{
}